

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O0

int Bmcs_ManCollect_rec(Bmcs_Man_t *p,int iObj)

{
  Gia_Man_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int iLit1;
  int iLit0;
  int iLitClean;
  int iSatVar;
  Gia_Obj_t *pObj;
  int iObj_local;
  Bmcs_Man_t *p_local;
  
  p_local._4_4_ = Gia_ObjCopyArray(p->pFrames,iObj);
  if (p_local._4_4_ < 0) {
    pGVar4 = Gia_ManObj(p->pFrames,iObj);
    iVar1 = Vec_IntEntry(&p->vFr2Sat,iObj);
    if ((iVar1 < 1) && (iVar1 = Gia_ObjIsCi(pGVar4), iVar1 == 0)) {
      iVar1 = Gia_ObjIsAnd(pGVar4);
      if (iVar1 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcS.c"
                      ,0x1e5,"int Bmcs_ManCollect_rec(Bmcs_Man_t *, int)");
      }
      iVar1 = Gia_ObjFaninId0(pGVar4,iObj);
      iVar1 = Bmcs_ManCollect_rec(p,iVar1);
      iVar2 = Gia_ObjFaninId1(pGVar4,iObj);
      iVar2 = Bmcs_ManCollect_rec(p,iVar2);
      iVar3 = Gia_ObjFaninC0(pGVar4);
      iVar1 = Abc_LitNotCond(iVar1,iVar3);
      iVar3 = Gia_ObjFaninC1(pGVar4);
      iVar2 = Abc_LitNotCond(iVar2,iVar3);
      iLit1 = Gia_ManAppendAnd(p->pClean,iVar1,iVar2);
    }
    else {
      iLit1 = Gia_ManAppendCi(p->pClean);
    }
    iVar1 = Abc_LitIsCompl(iLit1);
    if (iVar1 != 0) {
      __assert_fail("!Abc_LitIsCompl(iLitClean)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcS.c"
                    ,0x1e6,"int Bmcs_ManCollect_rec(Bmcs_Man_t *, int)");
    }
    p_00 = p->pClean;
    iVar1 = Abc_Lit2Var(iLit1);
    pGVar4 = Gia_ManObj(p_00,iVar1);
    pGVar4->Value = iObj;
    Gia_ObjSetCopyArray(p->pFrames,iObj,iLit1);
    p_local._4_4_ = iLit1;
  }
  return p_local._4_4_;
}

Assistant:

int Bmcs_ManCollect_rec( Bmcs_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj; 
    int iSatVar, iLitClean = Gia_ObjCopyArray( p->pFrames, iObj );
    if ( iLitClean >= 0 )
        return iLitClean;
    pObj = Gia_ManObj( p->pFrames, iObj );
    iSatVar = Vec_IntEntry( &p->vFr2Sat, iObj );
    if ( iSatVar > 0 || Gia_ObjIsCi(pObj) )
        iLitClean = Gia_ManAppendCi( p->pClean );
    else if ( Gia_ObjIsAnd(pObj) )
    {
        int iLit0 = Bmcs_ManCollect_rec( p, Gia_ObjFaninId0(pObj, iObj) );
        int iLit1 = Bmcs_ManCollect_rec( p, Gia_ObjFaninId1(pObj, iObj) );
        iLit0 = Abc_LitNotCond( iLit0, Gia_ObjFaninC0(pObj) );
        iLit1 = Abc_LitNotCond( iLit1, Gia_ObjFaninC1(pObj) );
        iLitClean = Gia_ManAppendAnd( p->pClean, iLit0, iLit1 );
    }
    else assert( 0 );
    assert( !Abc_LitIsCompl(iLitClean) );
    Gia_ManObj( p->pClean, Abc_Lit2Var(iLitClean) )->Value = iObj;
    Gia_ObjSetCopyArray( p->pFrames, iObj, iLitClean );
    return iLitClean;
}